

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_compile_augment(lysc_ctx *ctx,lysp_node_augment *aug_p,lysc_node *target)

{
  void **ppvVar1;
  ly_ctx *ctx_00;
  lysc_ext_instance *plVar2;
  bool bVar3;
  ly_bool child_unres_disabled;
  undefined4 in_EAX;
  LY_ERR LVar4;
  lysc_node_action **pplVar5;
  lysc_node_notif **pplVar6;
  char *pcVar7;
  long *plVar8;
  lysp_ext_instance *plVar9;
  lysp_ext_instance *plVar10;
  uint32_t uVar11;
  char *format;
  void *pvVar12;
  long lVar13;
  lysp_node_action **pplVar14;
  ly_bool enabled;
  undefined4 uStack_38;
  uint32_t local_34;
  
  if ((target->nodetype & 0x3493) == 0) {
    __assert_fail("target->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_CHOICE | LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                  ,0x7ef,
                  "LY_ERR lys_compile_augment(struct lysc_ctx *, struct lysp_node_augment *, struct lysc_node *)"
                 );
  }
  uVar11 = ctx->compile_opts;
  uStack_38 = in_EAX;
  if ((aug_p->actions == (lysp_node_action *)0x0) ||
     (pplVar5 = lysc_node_actions_p(target), pplVar5 != (lysc_node_action **)0x0)) {
    if ((aug_p->notifs == (lysp_node_notif *)0x0) ||
       (pplVar6 = lysc_node_notifs_p(target), pplVar6 != (lysc_node_notif **)0x0)) {
      LVar4 = lys_eval_iffeatures(ctx->ctx,(aug_p->field_0).node.iffeatures,
                                  (ly_bool *)((long)&uStack_38 + 3));
      if (LVar4 == LY_SUCCESS) {
        if ((uStack_38._3_1_ == '\0') && ((ctx->compile_opts & 0xb) == 0)) {
          ctx->compile_opts = ctx->compile_opts | 2;
          child_unres_disabled = '\x01';
        }
        else {
          child_unres_disabled = '\0';
        }
        LVar4 = lys_compile_augment_children
                          (ctx,aug_p->when,(aug_p->field_0).node.flags,aug_p->child,target,
                           child_unres_disabled);
        if (((LVar4 == LY_SUCCESS) &&
            (LVar4 = lys_compile_augment_children
                               (ctx,aug_p->when,(aug_p->field_0).node.flags,
                                (lysp_node *)aug_p->actions,target,child_unres_disabled),
            LVar4 == LY_SUCCESS)) &&
           (LVar4 = lys_compile_augment_children
                              (ctx,aug_p->when,(aug_p->field_0).node.flags,
                               (lysp_node *)aug_p->notifs,target,child_unres_disabled),
           LVar4 == LY_SUCCESS)) {
          plVar9 = (aug_p->field_0).node.exts;
          if (plVar9 == (lysp_ext_instance *)0x0) {
            LVar4 = LY_SUCCESS;
          }
          else {
            plVar2 = target->exts;
            if (plVar2 == (lysc_ext_instance *)0x0) {
              pvVar12 = (void *)0x0;
            }
            else {
              pvVar12 = plVar2[-1].compiled;
            }
            _uStack_38 = CONCAT44(uVar11,uStack_38);
            if (plVar2 == (lysc_ext_instance *)0x0) {
              plVar8 = (long *)calloc(1,((long)&(plVar9[-1].exts)->name + (long)pvVar12) * 0x48 + 8)
              ;
            }
            else {
              plVar8 = (long *)realloc(&plVar2[-1].compiled,
                                       ((long)&(plVar9[-1].exts)->name +
                                       (long)plVar2[-1].compiled + (long)pvVar12) * 0x48 + 8);
            }
            if (plVar8 == (long *)0x0) {
              bVar3 = false;
              LVar4 = LY_EMEM;
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_augment");
            }
            else {
              target->exts = (lysc_ext_instance *)(plVar8 + 1);
              plVar9 = (aug_p->field_0).node.exts;
              LVar4 = LY_SUCCESS;
              if (plVar9 == (lysp_ext_instance *)0x0) {
                plVar9 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar9 = plVar9[-1].exts;
              }
              memset(plVar8 + *plVar8 * 9 + 1,0,((long)&plVar9->name + (long)pvVar12) * 0x48);
              bVar3 = true;
            }
            if (bVar3) {
              lVar13 = 0;
              plVar9 = (lysp_ext_instance *)0x0;
              do {
                plVar10 = (aug_p->field_0).node.exts;
                if (plVar10 == (lysp_ext_instance *)0x0) {
                  plVar10 = (lysp_ext_instance *)0x0;
                }
                else {
                  plVar10 = plVar10[-1].exts;
                }
                if (plVar10 <= plVar9) break;
                plVar2 = target->exts;
                pvVar12 = plVar2[-1].compiled;
                plVar2[-1].compiled = (void *)((long)pvVar12 + 1);
                LVar4 = lys_compile_ext(ctx,(lysp_ext_instance *)
                                            ((long)&((aug_p->field_0).node.exts)->name + lVar13),
                                        plVar2 + (-(ulong)(plVar2 == (lysc_ext_instance *)0x0) |
                                                 (ulong)pvVar12),target);
                if (LVar4 != LY_SUCCESS) {
                  if (LVar4 != LY_ENOT) break;
                  ppvVar1 = &target->exts[-1].compiled;
                  *ppvVar1 = (void *)((long)*ppvVar1 + -1);
                }
                plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
                lVar13 = lVar13 + 0x70;
                LVar4 = LY_SUCCESS;
              } while( true );
            }
            uVar11 = local_34;
          }
        }
      }
      goto LAB_00153123;
    }
    pplVar14 = (lysp_node_action **)&aug_p->notifs;
    format = "Invalid augment of %s node which is not allowed to contain notification node \"%s\".";
  }
  else {
    pplVar14 = &aug_p->actions;
    format = "Invalid augment of %s node which is not allowed to contain RPC/action node \"%s\".";
  }
  ctx_00 = ctx->ctx;
  pcVar7 = lys_nodetype2str(target->nodetype);
  ly_vlog(ctx_00,(char *)0x0,LYVE_REFERENCE,format,pcVar7,((*pplVar14)->field_0).node.name);
  LVar4 = LY_EVALID;
LAB_00153123:
  ctx->compile_opts = uVar11;
  return LVar4;
}

Assistant:

static LY_ERR
lys_compile_augment(struct lysc_ctx *ctx, struct lysp_node_augment *aug_p, struct lysc_node *target)
{
    LY_ERR rc = LY_SUCCESS;
    ly_bool enabled, child_unres_disabled = 0;
    uint32_t opt_prev = ctx->compile_opts;

    assert(target->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_CHOICE | LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));

    /* nodetype checks */
    if (aug_p->actions && !lysc_node_actions_p(target)) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                "Invalid augment of %s node which is not allowed to contain RPC/action node \"%s\".",
                lys_nodetype2str(target->nodetype), aug_p->actions->name);
        rc = LY_EVALID;
        goto cleanup;
    }
    if (aug_p->notifs && !lysc_node_notifs_p(target)) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                "Invalid augment of %s node which is not allowed to contain notification node \"%s\".",
                lys_nodetype2str(target->nodetype), aug_p->notifs->name);
        rc = LY_EVALID;
        goto cleanup;
    }

    /* augment if-features */
    LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, aug_p->iffeatures, &enabled), cleanup);
    if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
        ctx->compile_opts |= LYS_COMPILE_DISABLED;
        child_unres_disabled = 1;
    }

    /* augment children */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, aug_p->child, target, child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* augment actions */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, (struct lysp_node *)aug_p->actions, target,
            child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* augment notifications */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, (struct lysp_node *)aug_p->notifs, target,
            child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* compile extensions into the target */
    COMPILE_EXTS_GOTO(ctx, aug_p->exts, target->exts, target, rc, cleanup);

cleanup:
    ctx->compile_opts = opt_prev;
    return rc;
}